

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O3

void uv__process_child_init
               (uv_process_options_t *options,int stdio_count,int (*pipes) [2],int error_fd)

{
  char *pcVar1;
  int fd;
  int iVar2;
  int __fd;
  uint uVar3;
  int *piVar4;
  __sighandler_t p_Var5;
  pthread_t __th;
  ulong uVar6;
  ulong uVar7;
  cpu_set_t cpuset;
  sigset_t set;
  cpu_set_t local_138;
  sigset_t local_b0;
  
  uVar6 = (ulong)(uint)stdio_count;
  if ((options->flags & 8) != 0) {
    setsid();
  }
  if (0 < stdio_count) {
    uVar7 = 0;
    do {
      if ((uint)pipes[uVar7][1] < uVar7) {
        iVar2 = fcntl(pipes[uVar7][1],0,uVar6);
        pipes[uVar7][1] = iVar2;
        if (iVar2 == -1) goto LAB_00525848;
      }
      uVar7 = uVar7 + 1;
    } while (uVar6 != uVar7);
    if (0 < stdio_count) {
      iVar2 = 0;
      do {
        __fd = pipes[iVar2][1];
        if (__fd < 0) {
          if (iVar2 < 3) {
            __fd = open("/dev/null",(uint)(iVar2 != 0) * 2);
            fd = __fd;
            if (-1 < __fd) goto LAB_005256e8;
LAB_00525920:
            piVar4 = __errno_location();
            iVar2 = -*piVar4;
            goto LAB_00525854;
          }
        }
        else {
          fd = pipes[iVar2][0];
LAB_005256e8:
          if (iVar2 == __fd) {
            uv__cloexec_fcntl(iVar2,0);
          }
          else {
            iVar2 = dup2(__fd,iVar2);
            if (iVar2 == -1) goto LAB_00525920;
          }
          if (iVar2 < 3) {
            uv__nonblock_fcntl(iVar2,0);
          }
          if (stdio_count <= fd) {
            uv__close(fd);
          }
        }
        iVar2 = iVar2 + 1;
      } while (iVar2 < stdio_count);
      if (0 < stdio_count) {
        uVar7 = 0;
        do {
          if (stdio_count <= pipes[uVar7][1]) {
            uv__close(pipes[uVar7][1]);
          }
          uVar7 = uVar7 + 1;
        } while (uVar6 != uVar7);
      }
    }
  }
  if (options->cwd != (char *)0x0) {
    iVar2 = chdir(options->cwd);
    if (iVar2 == 0) goto LAB_00525772;
LAB_00525848:
    piVar4 = __errno_location();
    iVar2 = -*piVar4;
    goto LAB_00525854;
  }
LAB_00525772:
  uVar3 = options->flags;
  if ((uVar3 & 3) != 0) {
    piVar4 = __errno_location();
    iVar2 = *piVar4;
    setgroups(0,(__gid_t *)0x0);
    *piVar4 = iVar2;
    uVar3 = options->flags;
  }
  if ((uVar3 & 2) != 0) {
    iVar2 = setgid(options->gid);
    if (iVar2 != 0) goto LAB_00525848;
    uVar3 = options->flags;
  }
  if ((uVar3 & 1) != 0) {
    iVar2 = setuid(options->uid);
    if (iVar2 != 0) goto LAB_00525848;
  }
  if (options->cpumask == (char *)0x0) {
LAB_005257cc:
    if (options->env != (char **)0x0) {
      _environ = options->env;
    }
    iVar2 = 1;
    do {
      if ((iVar2 != 9) && (iVar2 != 0x13)) {
        p_Var5 = signal(iVar2,(__sighandler_t)0x0);
        if (p_Var5 == (__sighandler_t)0xffffffffffffffff) goto LAB_00525848;
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 != 0x20);
    sigemptyset(&local_b0);
    iVar2 = pthread_sigmask(2,&local_b0,(__sigset_t *)0x0);
    if (iVar2 == 0) {
      execvp(options->file,options->args);
      piVar4 = __errno_location();
      iVar2 = -*piVar4;
      goto LAB_00525854;
    }
  }
  else {
    uVar3 = uv_cpumask_size();
    if (options->cpumask_size < (ulong)(long)(int)uVar3) {
      __assert_fail("options->cpumask_size >= (size_t)cpumask_size",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/process.c"
                    ,0x18e,
                    "void uv__process_child_init(const uv_process_options_t *, int, int (*)[2], int)"
                   );
    }
    local_138.__bits[0xe] = 0;
    local_138.__bits[0xf] = 0;
    local_138.__bits[0xc] = 0;
    local_138.__bits[0xd] = 0;
    local_138.__bits[10] = 0;
    local_138.__bits[0xb] = 0;
    local_138.__bits[8] = 0;
    local_138.__bits[9] = 0;
    local_138.__bits[6] = 0;
    local_138.__bits[7] = 0;
    local_138.__bits[4] = 0;
    local_138.__bits[5] = 0;
    local_138.__bits[2] = 0;
    local_138.__bits[3] = 0;
    local_138.__bits[0] = 0;
    local_138.__bits[1] = 0;
    if (0 < (int)uVar3) {
      pcVar1 = options->cpumask;
      uVar6 = 0;
      do {
        if ((uVar6 < 0x400) && (pcVar1[uVar6] != '\0')) {
          local_138.__bits[uVar6 >> 6] = local_138.__bits[uVar6 >> 6] | 1L << ((byte)uVar6 & 0x3f);
        }
        uVar6 = uVar6 + 1;
      } while (uVar3 != uVar6);
    }
    __th = pthread_self();
    iVar2 = pthread_setaffinity_np(__th,0x80,&local_138);
    if (iVar2 == 0) goto LAB_005257cc;
  }
  iVar2 = -iVar2;
LAB_00525854:
  uv__write_int(error_fd,iVar2);
  _exit(0x7f);
}

Assistant:

static void uv__process_child_init(const uv_process_options_t* options,
                                   int stdio_count,
                                   int (*pipes)[2],
                                   int error_fd) {
  sigset_t set;
  int close_fd;
  int use_fd;
  int err;
  int fd;
  int n;
#ifndef CMAKE_BOOTSTRAP
#if defined(__linux__) || defined(__FreeBSD__)
  int r;
  int i;
  int cpumask_size;
  uv__cpu_set_t cpuset;
#endif
#endif

  if (options->flags & UV_PROCESS_DETACHED)
    setsid();

  /* First duplicate low numbered fds, since it's not safe to duplicate them,
   * they could get replaced. Example: swapping stdout and stderr; without
   * this fd 2 (stderr) would be duplicated into fd 1, thus making both
   * stdout and stderr go to the same fd, which was not the intention. */
  for (fd = 0; fd < stdio_count; fd++) {
    use_fd = pipes[fd][1];
    if (use_fd < 0 || use_fd >= fd)
      continue;
    pipes[fd][1] = fcntl(use_fd, F_DUPFD, stdio_count);
    if (pipes[fd][1] == -1) {
      uv__write_int(error_fd, UV__ERR(errno));
      _exit(127);
    }
  }

  for (fd = 0; fd < stdio_count; fd++) {
    close_fd = pipes[fd][0];
    use_fd = pipes[fd][1];

    if (use_fd < 0) {
      if (fd >= 3)
        continue;
      else {
        /* redirect stdin, stdout and stderr to /dev/null even if UV_IGNORE is
         * set
         */
        use_fd = open("/dev/null", fd == 0 ? O_RDONLY : O_RDWR);
        close_fd = use_fd;

        if (use_fd < 0) {
          uv__write_int(error_fd, UV__ERR(errno));
          _exit(127);
        }
      }
    }

    if (fd == use_fd)
      uv__cloexec_fcntl(use_fd, 0);
    else
      fd = dup2(use_fd, fd);

    if (fd == -1) {
      uv__write_int(error_fd, UV__ERR(errno));
      _exit(127);
    }

    if (fd <= 2)
      uv__nonblock_fcntl(fd, 0);

    if (close_fd >= stdio_count)
      uv__close(close_fd);
  }

  for (fd = 0; fd < stdio_count; fd++) {
    use_fd = pipes[fd][1];

    if (use_fd >= stdio_count)
      uv__close(use_fd);
  }

  if (options->cwd != NULL && chdir(options->cwd)) {
    uv__write_int(error_fd, UV__ERR(errno));
    _exit(127);
  }

  if (options->flags & (UV_PROCESS_SETUID | UV_PROCESS_SETGID)) {
    /* When dropping privileges from root, the `setgroups` call will
     * remove any extraneous groups. If we don't call this, then
     * even though our uid has dropped, we may still have groups
     * that enable us to do super-user things. This will fail if we
     * aren't root, so don't bother checking the return value, this
     * is just done as an optimistic privilege dropping function.
     */
    SAVE_ERRNO(setgroups(0, NULL));
  }

  if ((options->flags & UV_PROCESS_SETGID) && setgid(options->gid)) {
    uv__write_int(error_fd, UV__ERR(errno));
    _exit(127);
  }

  if ((options->flags & UV_PROCESS_SETUID) && setuid(options->uid)) {
    uv__write_int(error_fd, UV__ERR(errno));
    _exit(127);
  }

#ifndef CMAKE_BOOTSTRAP
#if defined(__linux__) || defined(__FreeBSD__)
  if (options->cpumask != NULL) {
    cpumask_size = uv_cpumask_size();
    assert(options->cpumask_size >= (size_t)cpumask_size);

    CPU_ZERO(&cpuset);
    for (i = 0; i < cpumask_size; ++i) {
      if (options->cpumask[i]) {
        CPU_SET(i, &cpuset);
      }
    }

    r = -pthread_setaffinity_np(pthread_self(), sizeof(cpuset), &cpuset);
    if (r != 0) {
      uv__write_int(error_fd, r);
      _exit(127);
    }
  }
#endif
#endif

  if (options->env != NULL) {
    environ = options->env;
  }

  /* Reset signal disposition.  Use a hard-coded limit because NSIG
   * is not fixed on Linux: it's either 32, 34 or 64, depending on
   * whether RT signals are enabled.  We are not allowed to touch
   * RT signal handlers, glibc uses them internally.
   */
  for (n = 1; n < 32; n += 1) {
    if (n == SIGKILL || n == SIGSTOP)
      continue;  /* Can't be changed. */

#if defined(__HAIKU__)
    if (n == SIGKILLTHR)
      continue;  /* Can't be changed. */
#endif

    if (SIG_ERR != signal(n, SIG_DFL))
      continue;

    uv__write_int(error_fd, UV__ERR(errno));
    _exit(127);
  }

  /* Reset signal mask. */
  sigemptyset(&set);
  err = pthread_sigmask(SIG_SETMASK, &set, NULL);

  if (err != 0) {
    uv__write_int(error_fd, UV__ERR(err));
    _exit(127);
  }

  execvp(options->file, options->args);
  uv__write_int(error_fd, UV__ERR(errno));
  _exit(127);
}